

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
          (cmNinjaTargetGenerator *this,cmNinjaVars *vars,string *config)

{
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar1;
  TargetType TVar2;
  cmValue cVar3;
  string *psVar4;
  mapped_type *pmVar5;
  bool bVar6;
  string_view source;
  string_view source_00;
  string pdbPath;
  string compilePdbPath;
  string local_128;
  undefined1 local_108 [48];
  cmAlphaNum local_d8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"MSVC_C_ARCHITECTURE_ID",(allocator<char> *)&local_88);
  cVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_d8);
  bVar6 = true;
  if (cVar3.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"MSVC_CXX_ARCHITECTURE_ID",(allocator<char> *)&local_68);
    cVar3 = cmMakefile::GetDefinition(this_00,(string *)local_108);
    bVar6 = true;
    if (cVar3.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"MSVC_CUDA_ARCHITECTURE_ID",(allocator<char> *)&local_a8);
      cVar3 = cmMakefile::GetDefinition(this_00,&local_128);
      bVar6 = cVar3.Value != (string *)0x0;
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::~string((string *)local_108);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  if (bVar6 != false) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::ComputeTargetCompilePDB
              (&local_88,&this->super_cmCommonTargetGenerator,config);
    TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar2 == EXECUTABLE) ||
         (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar2 == STATIC_LIBRARY)) ||
        (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar2 == SHARED_LIBRARY)) ||
       (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar2 == MODULE_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (&local_a8,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      local_d8.View_._M_len = local_a8._M_string_length;
      local_d8.View_._M_str = local_a8._M_dataplus._M_p;
      local_108._8_8_ = local_108 + 0x10;
      local_108._0_8_ = &DAT_00000001;
      local_108[0x10] = '/';
      cmGeneratorTarget::GetPDBName
                (&local_48,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      cmStrCat<std::__cxx11::string>(&local_68,&local_d8,(cmAlphaNum *)local_108,&local_48);
      std::__cxx11::string::operator=((string *)&local_128,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    pcVar1 = this->LocalGenerator;
    psVar4 = ConvertToNinjaPath(this,&local_128);
    source._M_str = (psVar4->_M_dataplus)._M_p;
    source._M_len = psVar4->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&local_d8,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"TARGET_PDB",(allocator<char> *)&local_68);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,(key_type *)local_108);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&local_d8);
    pcVar1 = this->LocalGenerator;
    psVar4 = ConvertToNinjaPath(this,&local_88);
    source_00._M_str = (psVar4->_M_dataplus)._M_p;
    source_00._M_len = psVar4->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&local_d8,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_00,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"TARGET_COMPILE_PDB",(allocator<char> *)&local_68);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,(key_type *)local_108);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&local_d8);
    EnsureParentDirectoryExists(this,&local_128);
    EnsureParentDirectoryExists(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_128);
    return bVar6;
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(
  cmNinjaVars& vars, const std::string& config) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB(config);
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = cmStrCat(this->GeneratorTarget->GetPDBDirectory(config), '/',
                         this->GeneratorTarget->GetPDBName(config));
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    this->EnsureParentDirectoryExists(pdbPath);
    this->EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}